

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall
crnlib::mipmapped_texture::mipmapped_texture(mipmapped_texture *this,mipmapped_texture *other)

{
  (this->m_name).m_buf_size = 0;
  (this->m_name).m_len = 0;
  (this->m_name).m_pStr = (char *)0x0;
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  (this->m_last_error).m_buf_size = 0;
  (this->m_last_error).m_len = 0;
  (this->m_last_error).m_pStr = (char *)0x0;
  *(undefined8 *)&this->m_format = 0;
  *(undefined8 *)((long)&(this->m_faces).m_p + 4) = 0;
  (this->m_faces).m_capacity = 0;
  operator=(this,other);
  return;
}

Assistant:

mipmapped_texture::mipmapped_texture(const mipmapped_texture& other)
    : m_width(0),
      m_height(0),
      m_comp_flags(pixel_format_helpers::cDefaultCompFlags),
      m_format(PIXEL_FMT_INVALID) {
  *this = other;
}